

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcards.cpp
# Opt level: O3

int Wildcard::wildcardfit(char *wildcard,char *test)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  char *local_20;
  char *local_18;
  
  cVar2 = *wildcard;
  local_20 = test;
  if (cVar2 == '\0') {
LAB_002805bf:
    uVar1 = 1;
  }
  else {
    local_18 = wildcard;
    do {
      wildcard = local_18;
      if (*local_20 == '\0') goto LAB_002805bf;
      if (cVar2 == '*') {
        uVar1 = asterisk(&local_18,&local_20);
        local_18 = local_18 + -1;
      }
      else {
        if (cVar2 == '?') {
          uVar1 = 1;
        }
        else {
          if (cVar2 == '[') {
            local_18 = local_18 + 1;
            uVar1 = set(&local_18,&local_20);
            goto LAB_002805a5;
          }
          uVar1 = (uint)(cVar2 == *local_20);
        }
        local_20 = local_20 + 1;
      }
LAB_002805a5:
      wildcard = local_18 + 1;
    } while ((uVar1 != 0) && (cVar2 = local_18[1], local_18 = wildcard, cVar2 != '\0'));
  }
  do {
    cVar2 = *wildcard;
    wildcard = wildcard + 1;
  } while (((byte)uVar1 & cVar2 == '*') != 0);
  uVar3 = 0;
  if (((byte)uVar1 != 0) && (*local_20 == '\0')) {
    uVar3 = (uint)(cVar2 == '\0');
  }
  return uVar3;
}

Assistant:

int Wildcard::wildcardfit(const char* wildcard, const char* test) {
  int fit = 1;

  for (; ('\000' != *wildcard) && (1 == fit) && ('\000' != *test); wildcard++) {
    switch (*wildcard) {
    case '[':
      wildcard++; /* leave out the opening square bracket */
      fit = set(&wildcard, &test);
      /* we don't need to decrement the wildcard as in case */
      /* of asterisk because the closing ] is still there */
      break;
    case '?':
      test++;
      break;
    case '*':
      fit = asterisk(&wildcard, &test);
      /* the asterisk was skipped by asterisk() but the loop will */
      /* increment by itself. So we have to decrement */
      wildcard--;
      break;
    default:
      fit = (int)(*wildcard == *test);
      test++;
    }
  }
  while ((*wildcard == '*') && (1 == fit))
    /* here the teststring is empty otherwise you cannot */
    /* leave the previous loop */
    wildcard++;
  return (int)((1 == fit) && ('\0' == *test) && ('\0' == *wildcard));
}